

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_22::Unsubtyping::run(Unsubtyping *this,Module *wasm)

{
  _Map_pointer ppHVar1;
  HeapType left;
  HeapType right;
  Module *module;
  bool bVar2;
  HeapTypeKind HVar3;
  iterator iVar4;
  Struct *pSVar5;
  Struct *pSVar6;
  iterator iVar7;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> _Var8;
  Type sub;
  Type super_00;
  PassRunner *pPVar9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  optional<wasm::HeapType> oVar13;
  Signature SVar14;
  Signature SVar15;
  ReFinalize local_1e0;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_78;
  __node_type *local_70;
  UniqueDeferredQueue<wasm::HeapType> *local_68;
  Module *local_60;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_58;
  HeapType local_50;
  mapped_type super;
  HeapType type;
  
  if (((wasm->features).features & 0x400) != 0) {
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_1e0,wasm);
    if ((PassRunner *)
        local_1e0.
        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
        .super_Pass._vptr_Pass !=
        local_1e0.
        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
        .super_Pass.runner) {
      pPVar9 = (PassRunner *)
               local_1e0.
               super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
               .super_Pass._vptr_Pass;
      do {
        super.id = (uintptr_t)pPVar9->_vptr_PassRunner;
        oVar13 = HeapType::getDeclaredSuperType(&super);
        if (((undefined1  [16])
             oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          noteSubtype(this,(HeapType)super.id,
                      oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
        }
        pPVar9 = (PassRunner *)&pPVar9->wasm;
      } while (pPVar9 != local_1e0.
                         super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                         .super_Pass.runner);
    }
    if ((PassRunner *)
        local_1e0.
        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
        .super_Pass._vptr_Pass != (PassRunner *)0x0) {
      operator_delete(local_1e0.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .super_Pass._vptr_Pass,
                      (long)local_1e0.
                            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                            .super_Pass.name._M_dataplus._M_p -
                      (long)local_1e0.
                            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                            .super_Pass._vptr_Pass);
    }
    local_60 = wasm;
    Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
    ::walkModule((Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                  *)&(this->
                     super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
                     ).
                     super_ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                 ,wasm);
    local_68 = &this->work;
    local_58 = &(this->supertypes)._M_h;
    local_78 = &(this->castTypes)._M_h;
    while (module = local_60,
          ppHVar1 = *(_Map_pointer *)
                     ((long)&(this->work).data.c.
                             super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Deque_impl_data._M_finish + 0x18),
          ((long)*(_Elt_pointer *)
                  ((long)&(this->work).data.c.
                          super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                          .super__Deque_impl_data._M_start + 0x10) -
           (long)(this->work).data.c.
                 super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)(this->work).data.c.
                 super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)*(_Elt_pointer *)
                  ((long)&(this->work).data.c.
                          super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                          .super__Deque_impl_data._M_finish + 8) >> 3) +
          ((((ulong)((long)ppHVar1 -
                    (long)*(_Map_pointer *)
                           ((long)&(this->work).data.c.
                                   super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
          (ulong)(ppHVar1 == (_Map_pointer)0x0)) * 0x40 != 0) {
      do {
        super.id = (uintptr_t)UniqueDeferredQueue<wasm::HeapType>::pop(local_68);
        iVar4 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_58,&super);
        if (iVar4.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
            _M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        local_50.id = *(ulong *)((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                                       ._M_cur + 0x10);
        if (local_50.id < 0x7d) goto switchD_00b6665d_default;
        HVar3 = HeapType::getKind(&super);
        switch(HVar3) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                             ,0x123);
        case Func:
          SVar14 = HeapType::getSignature(&super);
          sub = SVar14.results.id;
          SVar15 = HeapType::getSignature(&local_50);
          super_00 = SVar15.results.id;
          noteSubtype(this,SVar15.params.id,SVar14.params.id);
          goto LAB_00b6671a;
        case Struct:
          pSVar5 = HeapType::getStruct(&super);
          pSVar6 = HeapType::getStruct(&local_50);
          lVar12 = (long)(pSVar6->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pSVar6->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (lVar12 != 0) {
            lVar12 = lVar12 >> 4;
            lVar12 = lVar12 + (ulong)(lVar12 == 0);
            lVar10 = 0;
            do {
              noteSubtype(this,(Type)*(uintptr_t *)
                                      ((long)&(((pSVar5->fields).
                                                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->type).id
                                      + lVar10),
                          (Type)*(uintptr_t *)
                                 ((long)&(((pSVar6->fields).
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->type).id +
                                 lVar10));
              lVar10 = lVar10 + 0x10;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          break;
        case Array:
          HeapType::getArray((HeapType *)&local_1e0);
          sub.id = (uintptr_t)
                   local_1e0.
                   super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                   .super_Pass._vptr_Pass;
          HeapType::getArray((HeapType *)&local_1e0);
          super_00.id = (uintptr_t)
                        local_1e0.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .super_Pass._vptr_Pass;
LAB_00b6671a:
          noteSubtype(this,sub,super_00);
          break;
        case Cont:
          handle_unreachable("TODO: cont",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                             ,0x121);
        }
switchD_00b6665d_default:
        ppHVar1 = *(_Map_pointer *)
                   ((long)&(this->work).data.c.
                           super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Deque_impl_data._M_finish + 0x18);
      } while (((long)*(_Elt_pointer *)
                       ((long)&(this->work).data.c.
                               super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Deque_impl_data._M_start + 0x10) -
                (long)(this->work).data.c.
                      super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this->work).data.c.
                      super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur -
                (long)*(_Elt_pointer *)
                       ((long)&(this->work).data.c.
                               super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 8) >> 3) +
               ((((ulong)((long)ppHVar1 -
                         (long)*(_Map_pointer *)
                                ((long)&(this->work).data.c.
                                        super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1)
               + (ulong)(ppHVar1 == (_Map_pointer)0x0)) * 0x40 != 0);
      _Var8._M_cur = (__node_type *)(this->supertypes)._M_h._M_before_begin._M_nxt;
      while (_Var8._M_cur != (__node_type *)0x0) {
        left.id = *(uintptr_t *)
                   &((_Var8._M_cur)->
                    super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>).
                    super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>.
                    _M_storage._M_storage.__align;
        local_70 = _Var8._M_cur;
        do {
          local_1e0.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_Pass._vptr_Pass =
               *(_func_int ***)
                ((long)&((_Var8._M_cur)->
                        super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>
                        ._M_storage._M_storage + 8);
          iVar7 = std::
                  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_78,(key_type *)&local_1e0);
          if (iVar7.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            for (puVar11 = *(undefined8 **)
                            ((long)iVar7.
                                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
                                   ._M_cur + 0x20); puVar11 != (undefined8 *)0x0;
                puVar11 = (undefined8 *)*puVar11) {
              right.id = puVar11[1];
              bVar2 = HeapType::isSubType(left,right);
              if (bVar2) {
                noteSubtype(this,left,right);
              }
            }
          }
          _Var8._M_cur = (__node_type *)
                         std::
                         _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(local_58,(key_type *)
                                         ((long)&((_Var8._M_cur)->
                                                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                                                 ).
                                                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>
                                                 ._M_storage._M_storage + 8));
        } while (_Var8._M_cur != (__node_type *)0x0);
        _Var8._M_cur = (__node_type *)(local_70->super__Hash_node_base)._M_nxt;
      }
    }
    GlobalTypeRewriter::GlobalTypeRewriter((GlobalTypeRewriter *)&local_1e0,local_60);
    local_1e0.
    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)&PTR__GlobalTypeRewriter_01076858;
    super.id = 0;
    local_1e0.
    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
    super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack.fixed.
    _M_elems[0].func = (TaskFunc)this;
    GlobalTypeRewriter::update
              ((GlobalTypeRewriter *)&local_1e0,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&super);
    if (super.id != 0) {
      operator_delete((void *)super.id,-super.id);
    }
    GlobalTypeRewriter::~GlobalTypeRewriter((GlobalTypeRewriter *)&local_1e0);
    ReFinalize::ReFinalize(&local_1e0);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run(&local_1e0.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          ,(this->
           super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
           ).super_Pass.runner,module);
    local_1e0.
    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_01070c30;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1e0.breakTypes._M_h);
    if (local_1e0.
        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
        .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
        super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack.
        flexible.
        super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .
                      super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                      .
                      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e0.
                            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                            .
                            super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                            .
                            super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.
                            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                            .
                            super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                            .
                            super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    Pass::~Pass((Pass *)&local_1e0);
  }
  return;
}

Assistant:

void run(Module* wasm) override {
    if (!wasm->features.hasGC()) {
      return;
    }
    analyzePublicTypes(*wasm);
    walkModule(wasm);
    analyzeTransitiveDependencies();
    optimizeTypes(*wasm);
    // Cast types may be refinable if their source and target types are no
    // longer related. TODO: Experiment with running this only after checking
    // whether it is necessary.
    ReFinalize().run(getPassRunner(), wasm);
  }